

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_data.cpp
# Opt level: O0

void __thiscall csguide_webserver::HttpData::CloseTimer(HttpData *this)

{
  bool bVar1;
  TimerNode *in_RDI;
  shared_ptr<csguide_webserver::TimerNode> tempTimer;
  undefined4 in_stack_ffffffffffffffc8;
  uint uVar2;
  undefined4 in_stack_ffffffffffffffcc;
  __weak_ptr<csguide_webserver::TimerNode,_(__gnu_cxx::_Lock_policy)2> *in_stack_ffffffffffffffd0;
  __shared_ptr local_18 [24];
  
  std::weak_ptr<csguide_webserver::TimerNode>::lock
            ((weak_ptr<csguide_webserver::TimerNode> *)
             CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  bVar1 = std::__shared_ptr::operator_cast_to_bool(local_18);
  uVar2 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffc8);
  std::shared_ptr<csguide_webserver::TimerNode>::~shared_ptr
            ((shared_ptr<csguide_webserver::TimerNode> *)0x106919);
  if ((uVar2 & 0x1000000) != 0) {
    std::weak_ptr<csguide_webserver::TimerNode>::lock
              ((weak_ptr<csguide_webserver::TimerNode> *)CONCAT44(in_stack_ffffffffffffffcc,uVar2));
    std::__shared_ptr_access<csguide_webserver::TimerNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<csguide_webserver::TimerNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x106943);
    TimerNode::Deleted(in_RDI);
    std::__weak_ptr<csguide_webserver::TimerNode,_(__gnu_cxx::_Lock_policy)2>::reset
              (in_stack_ffffffffffffffd0);
    std::shared_ptr<csguide_webserver::TimerNode>::~shared_ptr
              ((shared_ptr<csguide_webserver::TimerNode> *)0x106965);
  }
  return;
}

Assistant:

void HttpData::CloseTimer() {
  // 首先判断Timer是否还在， 有可能已经超时释放
  if (timer_.lock()) {
    std::shared_ptr<TimerNode> tempTimer(timer_.lock());
      tempTimer->Deleted();
    // 断开weak_ptr
    timer_.reset();
  }
}